

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::check_component_match_front
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  bool bVar1;
  iterator_type iVar2;
  const_iterator __x;
  pointer pcVar3;
  vector<char32_t,_std::allocator<char32_t>_> *in_RDI;
  Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *unaff_retaddr;
  const_reverse_iterator query_rlast;
  const_reverse_iterator query_rit;
  const_reverse_iterator item_rlast;
  const_reverse_iterator item_rit;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffffa8;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  local_28;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffffe0;
  ReverseIterator *in_stack_ffffffffffffffe8;
  vector<char32_t,_std::allocator<char32_t>_> *item_rlast_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  item_rlast_00 = in_RDI;
  std::vector<char32_t,_std::allocator<char32_t>_>::crbegin
            ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffffa8._M_current);
  std::vector<char32_t,_std::allocator<char32_t>_>::crend
            ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffffa8._M_current);
  std::vector<char32_t,_std::allocator<char32_t>_>::crbegin
            ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffffa8._M_current);
  std::vector<char32_t,_std::allocator<char32_t>_>::crend
            ((vector<char32_t,_std::allocator<char32_t>_> *)in_stack_ffffffffffffffa8._M_current);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::reverse_iterator(&local_38,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                      *)&stack0xffffffffffffffe0);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::reverse_iterator(&local_40,&local_30);
  consume_path_component_match_front
            (unaff_retaddr,
             (ReverseIterator *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
             (ReverseIterator *)item_rlast_00,in_stack_ffffffffffffffe8,
             (ReverseIterator *)in_stack_ffffffffffffffe0._M_current);
  iVar2 = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
          ::base(&local_28);
  in_RDI[2].super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = iVar2._M_current;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)in_stack_ffffffffffffffa0._M_current,
                     (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                      *)in_RDI);
  *(bool *)((long)&in_RDI[4].super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                   super__Vector_impl_data._M_start + 4) = bVar1;
  __x = std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_RDI);
  pcVar3 = (pointer)__gnu_cxx::operator-
                              ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                                *)in_stack_ffffffffffffffa0._M_current,
                               (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                                *)in_RDI);
  in_RDI[4].super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar3;
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                             *)in_stack_ffffffffffffffa0._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                             *)in_RDI);
    if (!bVar1) {
      *(undefined4 *)
       &in_RDI[4].super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
      return true;
    }
    bVar1 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                             *)__x._M_current,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                             *)in_stack_ffffffffffffffa8._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                        *)&stack0xffffffffffffffa8,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                        *)&stack0xffffffffffffffe0);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                        *)&stack0xffffffffffffffa0,&local_30);
    consume_path_component_match_front
              (unaff_retaddr,
               (ReverseIterator *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (ReverseIterator *)item_rlast_00,in_stack_ffffffffffffffe8,
               (ReverseIterator *)in_stack_ffffffffffffffe0._M_current);
  }
  return false;
}

Assistant:

bool check_component_match_front() {
    auto item_rit = item_.crbegin();
    auto const item_rlast = item_.crend();
    auto query_rit = query_.crbegin();
    auto const query_rlast = query_.crend();

    // Consume the basename.
    consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                       query_rlast);
    qit_basename_ = query_rit.base();
    whole_basename_match_ = qit_basename_ == query_basename_;
    basename_match_count_ = query_.cend() - qit_basename_;

    // Try to consume the remainder of the query.
    while (query_rit != query_rlast) {
      if (item_rit == item_rlast) {
        return false;
      }
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
    }
    prefix_level_ = PrefixLevel::COMPONENT;
    return true;
  }